

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

void __thiscall rsg::TexLookup::evaluate(TexLookup *this,ExecutionContext *execCtx)

{
  VariableType *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  Scalar SVar4;
  Expression *pEVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Sampler2D *pSVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SamplerCube *pSVar8;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  pointer pSVar9;
  int comp_1;
  pointer pSVar10;
  long lVar11;
  int i;
  long lVar12;
  int comp;
  Vec4 p;
  Scalar local_48 [4];
  ConstPixelBufferAccess *local_38;
  VariableType *this_01;
  
  (*this->m_coordExpr->_vptr_Expression[4])();
  pEVar5 = this->m_lodBiasExpr;
  if (pEVar5 != (Expression *)0x0) {
    (*pEVar5->_vptr_Expression[4])(pEVar5,execCtx);
  }
  iVar6 = (*this->m_coordExpr->_vptr_Expression[5])();
  this_01 = (VariableType *)CONCAT44(extraout_var,iVar6);
  if (this->m_type < TYPE_LAST) {
    this_00 = &this->m_valueType;
    pSVar9 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
             _M_impl.super__Vector_impl_data._M_start;
    switch(this->m_type) {
    case TYPE_TEXTURE2D:
      pSVar7 = ExecutionContext::getSampler2D(execCtx,this->m_sampler);
      lVar12 = 0;
      do {
        VariableType::getElementType(this_01);
        fVar1 = *(float *)(extraout_RDX + lVar12 * 4);
        VariableType::getElementType(this_01);
        tcu::sampleLevelArray2D
                  ((ConstPixelBufferAccess *)local_48,(int)(pSVar7->m_texture->m_view).m_levels,
                   (Sampler *)(ulong)(uint)(pSVar7->m_texture->m_view).m_numLevels,fVar1,
                   *(float *)(extraout_RDX + 0x100 + lVar12 * 4),(int)pSVar7 + 8,0.0);
        lVar11 = 0;
        pSVar10 = pSVar9;
        do {
          SVar4 = local_48[lVar11];
          VariableType::getElementType(this_00);
          *pSVar10 = SVar4;
          lVar11 = lVar11 + 1;
          pSVar10 = pSVar10 + 0x40;
        } while (lVar11 != 4);
        lVar12 = lVar12 + 1;
        pSVar9 = pSVar9 + 1;
      } while (lVar12 != 0x40);
      break;
    case TYPE_TEXTURE2D_LOD:
      iVar6 = (*this->m_lodBiasExpr->_vptr_Expression[5])();
      pSVar7 = ExecutionContext::getSampler2D(execCtx,this->m_sampler);
      lVar12 = 0;
      do {
        VariableType::getElementType(this_01);
        fVar1 = *(float *)(extraout_RDX + lVar12 * 4);
        VariableType::getElementType(this_01);
        fVar2 = *(float *)(extraout_RDX + 0x100 + lVar12 * 4);
        VariableType::getElementType((VariableType *)CONCAT44(extraout_var_01,iVar6));
        tcu::sampleLevelArray2D
                  ((ConstPixelBufferAccess *)local_48,(int)(pSVar7->m_texture->m_view).m_levels,
                   (Sampler *)(ulong)(uint)(pSVar7->m_texture->m_view).m_numLevels,fVar1,fVar2,
                   (int)pSVar7 + 8,*(float *)(extraout_RDX_01 + lVar12 * 4));
        lVar11 = 0;
        pSVar10 = pSVar9;
        do {
          SVar4 = local_48[lVar11];
          VariableType::getElementType(this_00);
          *pSVar10 = SVar4;
          lVar11 = lVar11 + 1;
          pSVar10 = pSVar10 + 0x40;
        } while (lVar11 != 4);
        lVar12 = lVar12 + 1;
        pSVar9 = pSVar9 + 1;
      } while (lVar12 != 0x40);
      break;
    case TYPE_TEXTURE2D_PROJ:
      pSVar7 = ExecutionContext::getSampler2D(execCtx,this->m_sampler);
      lVar12 = 0;
      do {
        VariableType::getElementType(this_01);
        fVar1 = *(float *)(extraout_RDX + lVar12 * 4);
        VariableType::getElementType(this_01);
        fVar2 = *(float *)(extraout_RDX + 0x100 + lVar12 * 4);
        VariableType::getElementType(this_01);
        fVar3 = *(float *)(extraout_RDX + 0x200 + lVar12 * 4);
        tcu::sampleLevelArray2D
                  ((ConstPixelBufferAccess *)local_48,(int)(pSVar7->m_texture->m_view).m_levels,
                   (Sampler *)(ulong)(uint)(pSVar7->m_texture->m_view).m_numLevels,fVar1 / fVar3,
                   fVar2 / fVar3,(int)pSVar7 + 8,0.0);
        lVar11 = 0;
        pSVar10 = pSVar9;
        do {
          SVar4 = local_48[lVar11];
          VariableType::getElementType(this_00);
          *pSVar10 = SVar4;
          lVar11 = lVar11 + 1;
          pSVar10 = pSVar10 + 0x40;
        } while (lVar11 != 4);
        lVar12 = lVar12 + 1;
        pSVar9 = pSVar9 + 1;
      } while (lVar12 != 0x40);
      break;
    case TYPE_TEXTURE2D_PROJ_LOD:
      iVar6 = (*this->m_lodBiasExpr->_vptr_Expression[5])();
      pSVar7 = ExecutionContext::getSampler2D(execCtx,this->m_sampler);
      local_38 = (ConstPixelBufferAccess *)&pSVar7->m_sampler;
      lVar12 = 0;
      do {
        VariableType::getElementType(this_01);
        fVar1 = *(float *)(extraout_RDX + lVar12 * 4);
        VariableType::getElementType(this_01);
        fVar2 = *(float *)(extraout_RDX + 0x100 + lVar12 * 4);
        VariableType::getElementType(this_01);
        fVar3 = *(float *)(extraout_RDX + 0x200 + lVar12 * 4);
        VariableType::getElementType((VariableType *)CONCAT44(extraout_var_00,iVar6));
        tcu::sampleLevelArray2D
                  ((ConstPixelBufferAccess *)local_48,(int)(pSVar7->m_texture->m_view).m_levels,
                   (Sampler *)(ulong)(uint)(pSVar7->m_texture->m_view).m_numLevels,fVar1 / fVar3,
                   fVar2 / fVar3,(int)local_38,*(float *)(extraout_RDX_00 + lVar12 * 4));
        lVar11 = 0;
        pSVar10 = pSVar9;
        do {
          SVar4 = local_48[lVar11];
          VariableType::getElementType(this_00);
          *pSVar10 = SVar4;
          lVar11 = lVar11 + 1;
          pSVar10 = pSVar10 + 0x40;
        } while (lVar11 != 4);
        lVar12 = lVar12 + 1;
        pSVar9 = pSVar9 + 1;
      } while (lVar12 != 0x40);
      break;
    case TYPE_TEXTURECUBE:
      pSVar8 = ExecutionContext::getSamplerCube(execCtx,this->m_sampler);
      lVar12 = 0;
      do {
        VariableType::getElementType(this_01);
        fVar1 = *(float *)(extraout_RDX + lVar12 * 4);
        VariableType::getElementType(this_01);
        fVar2 = *(float *)(extraout_RDX + 0x100 + lVar12 * 4);
        VariableType::getElementType(this_01);
        tcu::TextureCubeView::sample
                  ((TextureCubeView *)local_48,(Sampler *)&pSVar8->m_texture->m_view,fVar1,fVar2,
                   *(float *)(extraout_RDX + 0x200 + lVar12 * 4),0.0);
        lVar11 = 0;
        pSVar10 = pSVar9;
        do {
          SVar4 = local_48[lVar11];
          VariableType::getElementType(this_00);
          *pSVar10 = SVar4;
          lVar11 = lVar11 + 1;
          pSVar10 = pSVar10 + 0x40;
        } while (lVar11 != 4);
        lVar12 = lVar12 + 1;
        pSVar9 = pSVar9 + 1;
      } while (lVar12 != 0x40);
      break;
    case TYPE_TEXTURECUBE_LOD:
      iVar6 = (*this->m_lodBiasExpr->_vptr_Expression[5])();
      pSVar8 = ExecutionContext::getSamplerCube(execCtx,this->m_sampler);
      local_38 = (ConstPixelBufferAccess *)&pSVar8->m_sampler;
      lVar12 = 0;
      do {
        VariableType::getElementType(this_01);
        fVar1 = *(float *)(extraout_RDX + lVar12 * 4);
        VariableType::getElementType(this_01);
        fVar2 = *(float *)(extraout_RDX + 0x100 + lVar12 * 4);
        VariableType::getElementType(this_01);
        fVar3 = *(float *)(extraout_RDX + 0x200 + lVar12 * 4);
        VariableType::getElementType((VariableType *)CONCAT44(extraout_var_02,iVar6));
        tcu::TextureCubeView::sample
                  ((TextureCubeView *)local_48,(Sampler *)&pSVar8->m_texture->m_view,fVar1,fVar2,
                   fVar3,*(float *)(extraout_RDX_02 + lVar12 * 4));
        lVar11 = 0;
        pSVar10 = pSVar9;
        do {
          SVar4 = local_48[lVar11];
          VariableType::getElementType(this_00);
          *pSVar10 = SVar4;
          lVar11 = lVar11 + 1;
          pSVar10 = pSVar10 + 0x40;
        } while (lVar11 != 4);
        lVar12 = lVar12 + 1;
        pSVar9 = pSVar9 + 1;
      } while (lVar12 != 0x40);
    }
  }
  return;
}

Assistant:

void TexLookup::evaluate (ExecutionContext& execCtx)
{
	// Evaluate coord and bias.
	m_coordExpr->evaluate(execCtx);
	if (m_lodBiasExpr)
		m_lodBiasExpr->evaluate(execCtx);

	ExecConstValueAccess	coords	= m_coordExpr->getValue();
	ExecValueAccess			dst		= m_value.getValue(m_valueType);

	switch (m_type)
	{
		case TYPE_TEXTURE2D:
		{
			const Sampler2D& tex = execCtx.getSampler2D(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				tcu::Vec4	p	= tex.sample(s, t, 0.0f);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURE2D_LOD:
		{
			ExecConstValueAccess	lod		= m_lodBiasExpr->getValue();
			const Sampler2D&		tex		= execCtx.getSampler2D(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		l	= lod.component(0).asFloat(i);
				tcu::Vec4	p	= tex.sample(s, t, l);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURE2D_PROJ:
		{
			const Sampler2D& tex = execCtx.getSampler2D(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		w	= coords.component(2).asFloat(i);
				tcu::Vec4	p	= tex.sample(s/w, t/w, 0.0f);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURE2D_PROJ_LOD:
		{
			ExecConstValueAccess	lod		= m_lodBiasExpr->getValue();
			const Sampler2D&		tex		= execCtx.getSampler2D(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		w	= coords.component(2).asFloat(i);
				float		l	= lod.component(0).asFloat(i);
				tcu::Vec4	p	= tex.sample(s/w, t/w, l);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURECUBE:
		{
			const SamplerCube& tex = execCtx.getSamplerCube(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		r	= coords.component(2).asFloat(i);
				tcu::Vec4	p	= tex.sample(s, t, r, 0.0f);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		case TYPE_TEXTURECUBE_LOD:
		{
			ExecConstValueAccess	lod		= m_lodBiasExpr->getValue();
			const SamplerCube&		tex		= execCtx.getSamplerCube(m_sampler);
			for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			{
				float		s	= coords.component(0).asFloat(i);
				float		t	= coords.component(1).asFloat(i);
				float		r	= coords.component(2).asFloat(i);
				float		l	= lod.component(0).asFloat(i);
				tcu::Vec4	p	= tex.sample(s, t, r, l);

				for (int comp = 0; comp < 4; comp++)
					dst.component(comp).asFloat(i) = p[comp];
			}
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}
}